

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::WhileStatement(SQCompiler *this)

{
  SQUnsignedInteger *pSVar1;
  SQUnsignedInteger SVar2;
  SQUnsignedInteger SVar3;
  SQUnsignedInteger SVar4;
  ulong uVar5;
  SQInteger SVar6;
  longlong *plVar7;
  ulong uVar8;
  long lVar9;
  SQFuncState *pSVar10;
  SQUnsignedInteger SVar11;
  SQFuncState *pSVar12;
  long targetpos;
  long lVar13;
  SQScope __oldscope__;
  SQInstruction local_50;
  SQInstruction local_48;
  SQInteger SStack_40;
  
  SVar2 = (this->_fs->_instructions)._size;
  SVar6 = SQLexer::Lex(&this->_lex);
  this->_token = SVar6;
  Expect(this,0x28);
  CommaExpr(this);
  Expect(this,0x29);
  pSVar10 = this->_fs;
  SVar3 = (pSVar10->_unresolvedbreaks)._size;
  SVar4 = (pSVar10->_unresolvedcontinues)._size;
  uVar5 = (pSVar10->_breaktargets)._allocated;
  uVar8 = (pSVar10->_breaktargets)._size;
  plVar7 = (pSVar10->_breaktargets)._vals;
  pSVar12 = pSVar10;
  if (uVar5 <= uVar8) {
    SVar11 = 4;
    if (uVar8 * 2 != 0) {
      SVar11 = uVar8 * 2;
    }
    plVar7 = (longlong *)sq_vm_realloc(plVar7,uVar5 << 3,SVar11 * 8);
    (pSVar10->_breaktargets)._vals = plVar7;
    (pSVar10->_breaktargets)._allocated = SVar11;
    uVar8 = (pSVar10->_breaktargets)._size;
    pSVar12 = this->_fs;
  }
  (pSVar10->_breaktargets)._size = uVar8 + 1;
  plVar7[uVar8] = 0;
  uVar5 = (pSVar12->_continuetargets)._allocated;
  plVar7 = (pSVar12->_continuetargets)._vals;
  uVar8 = (pSVar12->_continuetargets)._size;
  pSVar10 = pSVar12;
  if (uVar5 <= uVar8) {
    SVar11 = 4;
    if (uVar8 * 2 != 0) {
      SVar11 = uVar8 * 2;
    }
    plVar7 = (longlong *)sq_vm_realloc(plVar7,uVar5 << 3,SVar11 * 8);
    (pSVar12->_continuetargets)._vals = plVar7;
    (pSVar12->_continuetargets)._allocated = SVar11;
    uVar8 = (pSVar12->_continuetargets)._size;
    pSVar10 = this->_fs;
  }
  targetpos = SVar2 - 1;
  (pSVar12->_continuetargets)._size = uVar8 + 1;
  plVar7[uVar8] = 0;
  SVar6 = SQFuncState::PopTarget(pSVar10);
  local_48._arg0 = (uchar)SVar6;
  local_48._0_5_ = 0x1e00000000;
  local_48 = (SQInstruction)((ulong)local_48._4_2_ << 0x20);
  SQFuncState::AddInstruction(pSVar10,&local_48);
  pSVar10 = this->_fs;
  SVar2 = (pSVar10->_instructions)._size;
  local_48 = (SQInstruction)(this->_scope).outers;
  SStack_40 = (this->_scope).stacksize;
  (this->_scope).outers = pSVar10->_outers;
  SVar6 = SQFuncState::GetStackSize(pSVar10);
  (this->_scope).stacksize = SVar6;
  Statement(this,true);
  lVar9 = this->_fs->_outers;
  SVar6 = SQFuncState::GetStackSize(this->_fs);
  pSVar10 = this->_fs;
  lVar13 = (this->_scope).stacksize;
  if (SVar6 != lVar13) {
    SQFuncState::SetStackSize(pSVar10,lVar13);
    pSVar10 = this->_fs;
    if (lVar9 != pSVar10->_outers) {
      local_50._arg1 = (SQInt32)(this->_scope).stacksize;
      local_50.op = '<';
      local_50._arg0 = '\0';
      local_50._arg2 = '\0';
      local_50._arg3 = '\0';
      SQFuncState::AddInstruction(pSVar10,&local_50);
      pSVar10 = this->_fs;
    }
  }
  (this->_scope).outers = (SQInteger)local_48;
  (this->_scope).stacksize = SStack_40;
  local_50._arg1 = (int)targetpos - (int)(pSVar10->_instructions)._size;
  local_50.op = '\x1c';
  local_50._arg0 = '\0';
  local_50._arg2 = '\0';
  local_50._arg3 = '\0';
  SQFuncState::AddInstruction(pSVar10,&local_50);
  SQFuncState::SetIntructionParam(this->_fs,SVar2 - 1,1,(this->_fs->_instructions)._size - SVar2);
  pSVar10 = this->_fs;
  lVar13 = (pSVar10->_unresolvedbreaks)._size - SVar3;
  lVar9 = (pSVar10->_unresolvedcontinues)._size - SVar4;
  if (0 < lVar9) {
    ResolveContinues(this,pSVar10,lVar9,targetpos);
    pSVar10 = this->_fs;
  }
  if (0 < lVar13) {
    ResolveBreaks(this,pSVar10,lVar13);
    pSVar10 = this->_fs;
  }
  pSVar1 = &(pSVar10->_breaktargets)._size;
  *pSVar1 = *pSVar1 - 1;
  pSVar1 = &(pSVar10->_continuetargets)._size;
  *pSVar1 = *pSVar1 - 1;
  return;
}

Assistant:

void WhileStatement()
    {
        SQInteger jzpos, jmppos;
        jmppos = _fs->GetCurrentPos();
        Lex(); Expect(_SC('(')); CommaExpr(); Expect(_SC(')'));

        BEGIN_BREAKBLE_BLOCK();
        _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
        jzpos = _fs->GetCurrentPos();
        BEGIN_SCOPE();

        Statement();

        END_SCOPE();
        _fs->AddInstruction(_OP_JMP, 0, jmppos - _fs->GetCurrentPos() - 1);
        _fs->SetIntructionParam(jzpos, 1, _fs->GetCurrentPos() - jzpos);

        END_BREAKBLE_BLOCK(jmppos);
    }